

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall fasttext::Model::initSigmoid(Model *this)

{
  iterator __position;
  undefined8 in_RAX;
  int iVar1;
  undefined1 auVar2 [16];
  float fVar3;
  undefined8 uStack_28;
  
  iVar1 = 0;
  uStack_28 = in_RAX;
  do {
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar2 = vxorps_avx512vl(ZEXT416((uint)((float)iVar1 * 0.001953125 + -8.0)),auVar2);
    fVar3 = expf(auVar2._0_4_);
    fVar3 = 1.0 / (fVar3 + 1.0);
    uStack_28 = CONCAT44(fVar3,(undefined4)uStack_28);
    __position._M_current =
         (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&this->t_sigmoid_,__position,(float *)((long)&uStack_28 + 4));
    }
    else {
      *__position._M_current = fVar3;
      (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    iVar1 = iVar1 + 0x10;
  } while (iVar1 != 0x2010);
  return;
}

Assistant:

void Model::initSigmoid() {
	for (int i = 0; i < SIGMOID_TABLE_SIZE + 1; i++) {
		real x = real(i * 2 * MAX_SIGMOID) / SIGMOID_TABLE_SIZE - MAX_SIGMOID;
		t_sigmoid_.push_back(1.0 / (1.0 + std::exp(-x)));
	}
}